

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

void __thiscall Qentem::Value<char>::Value<unsigned_int>(Value<char> *this,uint num)

{
  uint num_local;
  Value<char> *this_local;
  
  QNumber64::QNumber64<unsigned_int>((QNumber64 *)this,num);
  this->type_ = Undefined;
  setTypeToUInt64(this);
  return;
}

Assistant:

explicit Value(Number_T num) noexcept : number_{num} {
        if QENTEM_CONST_EXPRESSION (IsFloat<Number_T>()) {
            setTypeToDouble();
        } else if QENTEM_CONST_EXPRESSION (IsUnsigned<Number_T>()) {
            setTypeToUInt64();
        } else {
            setTypeToInt64();
        }